

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

void accum_global_gauden_full
               (vector_t ****acc,vector_t ****l_acc,gauden_t *g,uint32 *lcl2glb,uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector_t pfVar5;
  vector_t pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (acc != (vector_t ****)0x0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    for (uVar9 = 0; uVar9 != n_lcl2glb; uVar9 = uVar9 + 1) {
      uVar3 = lcl2glb[uVar9];
      for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
        for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
          uVar4 = g->veclen[uVar7];
          for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
            pfVar5 = l_acc[uVar9][uVar7][uVar11][uVar10];
            pfVar6 = acc[uVar3][uVar7][uVar11][uVar10];
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              pfVar6[uVar8] = pfVar5[uVar8] + pfVar6[uVar8];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
accum_global_gauden_full(vector_t ****acc,
			 vector_t ****l_acc,
			 gauden_t *g,
			 uint32 *lcl2glb,
			 uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k, l, ll;

    if (acc == NULL) {
	/* nothing to do */

	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    /* for each mixture density */
    for (ii = 0; ii < n_lcl2glb; ii++) {
	/* map local density id to global one */
	i = lcl2glb[ii];

	/* for each feature */
	for (j = 0; j < n_feat; j++) {

	    /* for each density in the mixture density */
	    for (k = 0; k < n_density; k++) {
		
		for (l = 0; l < g->veclen[j]; l++) {
		    for (ll = 0; ll < g->veclen[j]; ll++) {
			acc[i][j][k][l][ll] += l_acc[ii][j][k][l][ll];
		    }
		}
	    }
	}
    }
}